

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cpp
# Opt level: O2

string * strStatus_abi_cxx11_
                   (string *__return_storage_ptr__,
                   vector<FileStatus,_std::allocator<FileStatus>_> *result)

{
  pointer pFVar1;
  ulong uVar2;
  ostream *poVar3;
  int i;
  ulong uVar4;
  long lVar5;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  lVar5 = 0;
  for (uVar4 = 0;
      pFVar1 = (result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>)._M_impl.
               super__Vector_impl_data._M_start,
      uVar4 < (ulong)(((long)(result->super__Vector_base<FileStatus,_std::allocator<FileStatus>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)pFVar1) / 0x28);
      uVar4 = uVar4 + 1) {
    uVar2 = (ulong)*(uint *)((long)&pFVar1->status + lVar5);
    if (uVar2 < 3) {
      std::operator<<(local_1a8,&DAT_0010a134 + *(int *)(&DAT_0010a134 + uVar2 * 4));
    }
    poVar3 = std::operator<<(local_1a8,
                             (string *)
                             ((long)&(((result->
                                       super__Vector_base<FileStatus,_std::allocator<FileStatus>_>).
                                       _M_impl.super__Vector_impl_data._M_start)->filename).
                                     _M_dataplus._M_p + lVar5));
    std::endl<char,std::char_traits<char>>(poVar3);
    lVar5 = lVar5 + 0x28;
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  return __return_storage_ptr__;
}

Assistant:

String strStatus(Vector<FileStatus> result){
    std::stringstream ss;
    for(int i = 0; i < result.size();i++){
        switch(result[i].status){
            case added:
                ss << "A ";
                break;
            case removed:
                ss << "R ";
                break;
            case modified:
                ss << "M ";
                break;
            case none:break;
        }
        ss << result[i].filename << Endl;
    }
    return ss.str();
}